

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.hxx
# Opt level: O0

string * msg_if_given_abi_cxx11_(char *format,...)

{
  char in_AL;
  int iVar1;
  ulong uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char msg [2048];
  size_t len;
  undefined1 local_918 [16];
  undefined8 local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined8 local_8d8;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  allocator local_859;
  undefined4 local_858;
  undefined4 local_854;
  undefined1 *local_850;
  undefined1 *local_848;
  char acStack_839 [2057];
  ulong local_30;
  allocator local_11;
  char *local_10;
  string *local_8;
  
  if (in_AL != '\0') {
    local_8e8 = in_XMM0_Qa;
    local_8d8 = in_XMM1_Qa;
    local_8c8 = in_XMM2_Qa;
    local_8b8 = in_XMM3_Qa;
    local_8a8 = in_XMM4_Qa;
    local_898 = in_XMM5_Qa;
    local_888 = in_XMM6_Qa;
    local_878 = in_XMM7_Qa;
  }
  local_908 = in_RDX;
  local_900 = in_RCX;
  local_8f8 = in_R8;
  local_8f0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*in_RSI == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    local_30 = 0;
    local_848 = local_918;
    local_850 = &stack0x00000008;
    local_854 = 0x30;
    local_858 = 0x10;
    iVar1 = vsnprintf(acStack_839 + 1,0x800,in_RSI,&local_858);
    uVar2 = (ulong)iVar1;
    local_30 = uVar2;
    if (acStack_839[uVar2] == '\n') {
      local_30 = uVar2 - 1;
      acStack_839[uVar2] = '\0';
    }
    uVar2 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,acStack_839 + 1,uVar2,&local_859);
    std::allocator<char>::~allocator((allocator<char> *)&local_859);
  }
  return in_RDI;
}

Assistant:

static inline std::string msg_if_given
                          ( const char* format,
                            ... ) {
#endif
    if (format[0] == 0x0) {
        return "";
    } else {
        _fix_format(format);
        size_t len = 0;
        char msg[2048];
        va_list args;
        va_start(args, format);
        len = vsnprintf(msg, 2048, format, args);
        va_end(args);

        // Get rid of newline at the end.
        if (msg[len-1] == '\n') {
            len--;
            msg[len] = 0x0;
        }
        return std::string(msg, len);
    }
}